

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::BeginSection
          (BinaryReaderObjdump *this,Index section_index,BinarySection section_code,Offset size)

{
  char *__s1;
  int iVar1;
  char *pcVar2;
  char *__s2;
  pointer this_00;
  bool bVar3;
  bool section_match;
  undefined1 local_58 [8];
  string match_name;
  char *section_name;
  Offset size_local;
  BinarySection section_code_local;
  Index section_index_local;
  BinaryReaderObjdump *this_local;
  
  BinaryReaderObjdumpBase::BeginSection
            (&this->super_BinaryReaderObjdumpBase,section_index,section_code,size);
  pcVar2 = GetSectionName(section_code);
  BinaryReaderObjdumpBase::GetSectionName(&this->super_BinaryReaderObjdumpBase,section_index);
  string_view::to_string_abi_cxx11_((string_view *)local_58);
  bVar3 = true;
  if (((this->super_BinaryReaderObjdumpBase).options_)->section_name != (char *)0x0) {
    __s1 = ((this->super_BinaryReaderObjdumpBase).options_)->section_name;
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp(__s1,__s2);
    bVar3 = iVar1 == 0;
  }
  if (bVar3) {
    (this->super_BinaryReaderObjdumpBase).section_found_ = true;
  }
  switch(((this->super_BinaryReaderObjdumpBase).options_)->mode) {
  case Prepass:
  case Disassemble:
    break;
  case Headers:
    printf("%9s start=%#010zx end=%#010zx (size=%#010zx) ",pcVar2,
           ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
           state)->offset,
           ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
           state)->offset + size,size);
    break;
  case Details:
    if (bVar3) {
      printf("%s");
      if (((section_code == Start) || (section_code == DataCount)) || (section_code == Custom)) {
        printf(":\n");
      }
      (this->super_BinaryReaderObjdumpBase).print_details_ = true;
    }
    else {
      (this->super_BinaryReaderObjdumpBase).print_details_ = false;
    }
    break;
  case RawData:
    if (bVar3) {
      printf("\nContents of section %s:\n",pcVar2);
      this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::
                operator->(&this->out_stream_);
      Stream::WriteMemoryDump
                (&this_00->super_Stream,
                 (this->super_BinaryReaderObjdumpBase).data_ +
                 ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                  super_BinaryReaderDelegate.state)->offset,size,
                 ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                  super_BinaryReaderDelegate.state)->offset,Yes,(char *)0x0,(char *)0x0);
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::__cxx11::string::~string((string *)local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginSection(Index section_index,
                                         BinarySection section_code,
                                         Offset size) {
  BinaryReaderObjdumpBase::BeginSection(section_index, section_code, size);

  // |section_name| and |match_name| are identical for known sections. For
  // custom sections, |section_name| is "Custom", but |match_name| is the name
  // of the custom section.
  const char* section_name = wabt::GetSectionName(section_code);
  std::string match_name = GetSectionName(section_index).to_string();

  bool section_match = !options_->section_name ||
                       !strcasecmp(options_->section_name, match_name.c_str());
  if (section_match) {
    section_found_ = true;
  }

  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("%9s start=%#010" PRIzx " end=%#010" PRIzx " (size=%#010" PRIoffset
             ") ",
             section_name, state->offset, state->offset + size, size);
      break;
    case ObjdumpMode::Details:
      if (section_match) {
        printf("%s", section_name);
        // All known section types except the Start and DataCount sections have
        // a count in which case this line gets completed in OnCount().
        if (section_code == BinarySection::Start ||
            section_code == BinarySection::DataCount ||
            section_code == BinarySection::Custom) {
          printf(":\n");
        }
        print_details_ = true;
      } else {
        print_details_ = false;
      }
      break;
    case ObjdumpMode::RawData:
      if (section_match) {
        printf("\nContents of section %s:\n", section_name);
        out_stream_->WriteMemoryDump(data_ + state->offset, size, state->offset,
                                     PrintChars::Yes);
      }
      break;
    case ObjdumpMode::Prepass:
    case ObjdumpMode::Disassemble:
      break;
  }
  return Result::Ok;
}